

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cameracollection.cc
# Opt level: O0

void __thiscall gvr::CameraCollection::loadPLY(CameraCollection *this,PLYReader *ply)

{
  undefined8 uVar1;
  IOException *in_RSI;
  allocator local_31;
  string local_30 [24];
  string *in_stack_ffffffffffffffe8;
  
  uVar1 = __cxa_allocate_exception(0x28);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_30,"Cannot load camera collection from PLY.",&local_31);
  gutil::IOException::IOException(in_RSI,in_stack_ffffffffffffffe8);
  __cxa_throw(uVar1,&gutil::IOException::typeinfo,gutil::IOException::~IOException);
}

Assistant:

void CameraCollection::loadPLY(PLYReader &ply)
{
  throw gutil::IOException("Cannot load camera collection from PLY.");
}